

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.cpp
# Opt level: O0

int llvm::APInt::tcDivide(WordType *lhs,WordType *rhs,WordType *remainder,WordType *srhs,uint parts)

{
  uint uVar1;
  int iVar2;
  bool bVar3;
  ulong uStack_48;
  int compare;
  WordType mask;
  uint local_38;
  uint n;
  uint shiftCount;
  uint parts_local;
  WordType *srhs_local;
  WordType *remainder_local;
  WordType *rhs_local;
  WordType *lhs_local;
  
  bVar3 = false;
  if ((lhs != remainder) && (bVar3 = false, lhs != srhs)) {
    bVar3 = remainder != srhs;
  }
  if (bVar3) {
    uVar1 = tcMSB(rhs,parts);
    if (uVar1 + 1 == 0) {
      lhs_local._4_4_ = 1;
    }
    else {
      local_38 = parts * 0x40 - (uVar1 + 1);
      mask._4_4_ = local_38 >> 6;
      uStack_48 = 1L << ((byte)local_38 & 0x3f);
      tcAssign(srhs,rhs,parts);
      tcShiftLeft(srhs,parts,local_38);
      tcAssign(remainder,lhs,parts);
      tcSet(lhs,0,parts);
      while( true ) {
        iVar2 = tcCompare(remainder,srhs,parts);
        if (-1 < iVar2) {
          tcSubtract(remainder,srhs,0,parts);
          lhs[mask._4_4_] = uStack_48 | lhs[mask._4_4_];
        }
        if (local_38 == 0) break;
        local_38 = local_38 - 1;
        tcShiftRight(srhs,parts,1);
        uStack_48 = uStack_48 >> 1;
        if (uStack_48 == 0) {
          uStack_48 = 0x8000000000000000;
          mask._4_4_ = mask._4_4_ - 1;
        }
      }
      lhs_local._4_4_ = 0;
    }
    return lhs_local._4_4_;
  }
  __assert_fail("lhs != remainder && lhs != srhs && remainder != srhs",
                "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APInt.cpp"
                ,0x9d7,
                "static int llvm::APInt::tcDivide(WordType *, const WordType *, WordType *, WordType *, unsigned int)"
               );
}

Assistant:

int APInt::tcDivide(WordType *lhs, const WordType *rhs,
                    WordType *remainder, WordType *srhs,
                    unsigned parts) {
  assert(lhs != remainder && lhs != srhs && remainder != srhs);

  unsigned shiftCount = tcMSB(rhs, parts) + 1;
  if (shiftCount == 0)
    return true;

  shiftCount = parts * APINT_BITS_PER_WORD - shiftCount;
  unsigned n = shiftCount / APINT_BITS_PER_WORD;
  WordType mask = (WordType) 1 << (shiftCount % APINT_BITS_PER_WORD);

  tcAssign(srhs, rhs, parts);
  tcShiftLeft(srhs, parts, shiftCount);
  tcAssign(remainder, lhs, parts);
  tcSet(lhs, 0, parts);

  /* Loop, subtracting SRHS if REMAINDER is greater and adding that to
     the total.  */
  for (;;) {
    int compare = tcCompare(remainder, srhs, parts);
    if (compare >= 0) {
      tcSubtract(remainder, srhs, 0, parts);
      lhs[n] |= mask;
    }

    if (shiftCount == 0)
      break;
    shiftCount--;
    tcShiftRight(srhs, parts, 1);
    if ((mask >>= 1) == 0) {
      mask = (WordType) 1 << (APINT_BITS_PER_WORD - 1);
      n--;
    }
  }

  return false;
}